

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_info.cpp
# Opt level: O3

RegSet * __thiscall
mocker::LoopInfo::findLoopInvariantVariables
          (RegSet *__return_storage_ptr__,LoopInfo *this,FunctionModule *func,size_t header,
          UseDefChain *useDef,FuncAttr *funcAttr)

{
  _List_node_base *inst;
  _List_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  BasicBlock *pBVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  pointer addr;
  char cVar13;
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Reg> reg;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  long local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long *local_68;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  key_type local_58;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_50;
  size_t local_38;
  
  local_60 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)useDef;
  local_38 = header;
  cVar7 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_38);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_68 = *(long **)((long)cVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                              ._M_cur + 0x20);
  if (local_68 != (long *)0x0) {
    do {
      pBVar8 = ir::FunctionModule::getBasicBlock(func,local_68[1]);
      for (p_Var1 = (pBVar8->insts).
                    super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var1 != (_List_node_base *)&pBVar8->insts; p_Var1 = p_Var1->_M_next) {
        switch(*(undefined4 *)&(p_Var1[1]._M_next)->_M_prev) {
        case 3:
        case 4:
        case 5:
        case 6:
        case 0xe:
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[1]._M_prev;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          inst = p_Var1 + 1;
          peVar3 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)&inst->_M_next)
                   ->_M_ptr;
          if (peVar3->type == Call) {
            p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[1]._M_prev;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            cVar9 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&(funcAttr->pureFuncs)._M_h,(key_type *)&peVar3[2].type);
            if (cVar9.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              }
              goto LAB_0015713d;
            }
          }
          else {
LAB_0015713d:
            ir::getDest((ir *)&local_88,(shared_ptr<mocker::ir::IRInst> *)inst);
            p_Var2 = local_80;
            if (local_88 != 0) {
              ir::getOperandsUsed(&local_50,(shared_ptr<mocker::ir::IRInst> *)inst);
              psVar4 = local_50.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (addr = local_50.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; addr != psVar4; addr = addr + 1
                  ) {
                ir::dycLocalReg((ir *)&local_78,addr);
                cVar13 = '\x03';
                if ((((local_78 != 0) &&
                     (bVar5 = isParameter(func,(string *)(local_78 + 8)), !bVar5)) &&
                    (iVar6 = std::__cxx11::string::compare((char *)(local_78 + 8)), iVar6 != 0)) &&
                   (cVar10 = std::
                             _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             ::find(&__return_storage_ptr__->_M_h,(key_type *)&local_78),
                   cVar10.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur
                   == (__node_type *)0x0)) {
                  cVar11 = std::
                           _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find(local_60,(key_type *)&local_78);
                  if (cVar11.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                      ._M_cur == (__node_type *)0x0) {
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  local_58 = *(key_type *)
                              ((long)cVar11.
                                     super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                                     ._M_cur + 0x18);
                  cVar12 = std::
                           _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                   *)((long)cVar7.
                                            super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                                            ._M_cur + 0x10),&local_58);
                  cVar13 = cVar12.super__Node_iterator_base<unsigned_long,_false>._M_cur !=
                           (__node_type *)0x0;
                }
                if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
                }
                if ((cVar13 != '\x03') && (cVar13 != '\0')) {
                  std::
                  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ::~vector(&local_50);
                  p_Var2 = local_80;
                  goto joined_r0x001572c2;
                }
              }
              std::
              vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ::~vector(&local_50);
              peVar3 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                       &inst->_M_next)->_M_ptr;
              if (peVar3->type == Call) {
                this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[1]._M_prev;
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                cVar9 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find(&(funcAttr->pureFuncs)._M_h,(key_type *)&peVar3[2].type);
                if (cVar9.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  p_Var2 = local_80;
                  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                    p_Var2 = local_80;
                  }
                  goto joined_r0x001572c2;
                }
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
              }
              std::
              _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::shared_ptr<mocker::ir::Reg>&>
                        ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)__return_storage_ptr__,&local_88);
              p_Var2 = local_80;
            }
          }
joined_r0x001572c2:
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
        }
      }
      local_68 = (long *)*local_68;
    } while (local_68 != (long *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ir::RegSet LoopInfo::findLoopInvariantVariables(const ir::FunctionModule &func,
                                                std::size_t header,
                                                const UseDefChain &useDef,
                                                const FuncAttr &funcAttr) {
  const auto &loopNodes = getLoops().at(header);

  ir::RegSet res;

  auto isLoopInvariant = [&res, &loopNodes, &useDef,
                          &func](const std::shared_ptr<ir::IRInst> &inst) {
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      auto reg = ir::dycLocalReg(operand);
      if (!reg) {
        continue;
      }
      if (isParameter(func, reg->getIdentifier()) ||
          reg->getIdentifier() == ".phi_nan")
        continue;
      if (isIn(res, reg))
        continue;

      const auto &def = useDef.getDef(reg);
      if (isIn(loopNodes, def.getBBLabel())) {
        return false;
      }
    }
    return true;
  };

  for (auto node : loopNodes) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      if (!ir::dyc<ir::Assign>(inst) && !ir::dyc<ir::ArithUnaryInst>(inst) &&
          !ir::dyc<ir::ArithBinaryInst>(inst) &&
          !ir::dyc<ir::RelationInst>(inst) && !ir::dyc<ir::Call>(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      if (!isLoopInvariant(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      res.emplace(dest);
    }
  }

  return res;
}